

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O1

void __thiscall cs::statement_default::run_impl(statement_default *this)

{
  runtime_error *this_00;
  string local_38;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Do not allowed standalone default statement.","");
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void run_impl() override
		{
			throw runtime_error("Do not allowed standalone default statement.");
		}